

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# real.c
# Opt level: O1

fft_real_object fft_real_init(int N,int sgn)

{
  fft_real_object pfVar1;
  fft_real_object pfVar2;
  fft_object pfVar3;
  ulong uVar4;
  uint N_00;
  double *pdVar5;
  double dVar6;
  double dVar7;
  
  N_00 = N / 2;
  pfVar2 = (fft_real_object)malloc((long)(int)N_00 * 0x10 + 0x18);
  pfVar3 = fft_init(N_00,sgn);
  pfVar2->cobj = pfVar3;
  if (1 < N) {
    uVar4 = 0;
    pfVar1 = pfVar2;
    do {
      pdVar5 = &pfVar1->twiddle2[0].im;
      dVar6 = ((double)(int)uVar4 * 6.283185307179586) / (double)N;
      dVar7 = cos(dVar6);
      pfVar1->twiddle2[0].re = dVar7;
      dVar6 = sin(dVar6);
      *pdVar5 = dVar6;
      uVar4 = uVar4 + 1;
      pfVar1 = (fft_real_object)pdVar5;
    } while (N_00 != uVar4);
  }
  return pfVar2;
}

Assistant:

fft_real_object fft_real_init(int N, int sgn) {
	fft_real_object obj = NULL;
	fft_type PI, theta;
	int k;
	
	PI = 3.1415926535897932384626433832795;
	
	obj = (fft_real_object) malloc (sizeof(struct fft_real_set) + sizeof(fft_data)* (N/2));
	
	obj->cobj = fft_init(N/2,sgn);
	
	for (k = 0; k < N/2;++k) {
		theta = PI2*k/N;
		obj->twiddle2[k].re = cos(theta);
		obj->twiddle2[k].im = sin(theta);
		
	}


	return obj;
	
	
}